

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_step(void)

{
  size_t sVar1;
  fsnav_plugin *pfVar2;
  bool local_11;
  size_t i;
  
  (fsnav->core).current_plugin_id = 0;
  do {
    if ((fsnav->core).plugin_count <= (fsnav->core).current_plugin_id) {
LAB_0010aaa6:
      if (fsnav->mode == 0) {
        fsnav->mode = 1;
      }
      local_11 = true;
      if (fsnav->mode < 0) {
        local_11 = (fsnav->core).exit_plugin_id < 0xffffffff;
      }
      return local_11;
    }
    sVar1 = (fsnav->core).current_plugin_id;
    if ((fsnav->mode < 1) ||
       ((0 < (fsnav->core).plugins[sVar1].cycle &&
        ((fsnav->core).plugins[sVar1].tick == (fsnav->core).plugins[sVar1].shift)))) {
      (*(fsnav->core).plugins[sVar1].func)();
    }
    pfVar2 = (fsnav->core).plugins;
    pfVar2[sVar1].tick = pfVar2[sVar1].tick + 1;
    if ((fsnav->core).plugins[sVar1].cycle <= (fsnav->core).plugins[sVar1].tick) {
      (fsnav->core).plugins[sVar1].tick = 0;
    }
    if ((fsnav->core).exit_plugin_id == sVar1) {
      (fsnav->core).exit_plugin_id = 0xffffffff;
      (fsnav->core).host_termination = '\0';
      fsnav_free();
      goto LAB_0010aaa6;
    }
    if (((fsnav->mode < 0) || ((fsnav->core).host_termination == '\x01')) &&
       ((fsnav->core).exit_plugin_id == 0xffffffff)) {
      if (0 < fsnav->mode) {
        fsnav->mode = -1;
      }
      if (fsnav->mode != 0) {
        (fsnav->core).exit_plugin_id = sVar1;
      }
    }
    (fsnav->core).current_plugin_id = (fsnav->core).current_plugin_id + 1;
  } while( true );
}

Assistant:

char fsnav_step(void)
{
	size_t i;

	// loop through plugin execution list
	for (fsnav->core.current_plugin_id = 0; fsnav->core.current_plugin_id < fsnav->core.plugin_count; fsnav->core.current_plugin_id++) {
		i = fsnav->core.current_plugin_id;

		if (fsnav->mode <= 0                                                                                    // init/termination mode
			|| (fsnav->core.plugins[i].cycle > 0 && fsnav->core.plugins[i].tick == fsnav->core.plugins[i].shift)) // or the scheduled tick has come
			fsnav->core.plugins[i].func();                                                                      // execute the current plugin

		fsnav->core.plugins[i].tick++;                                  // current tick increment
		if (fsnav->core.plugins[i].tick >= fsnav->core.plugins[i].cycle) // check to stay within the cycle
			fsnav->core.plugins[i].tick = 0;                            // reset tick

		if (fsnav->core.exit_plugin_id == i)	{     // if termination was initiated by the current plugin on the previous loop
			fsnav->core.exit_plugin_id = UINT_MAX; // set to default
			fsnav->core.host_termination = 0;      // set to default
			fsnav_free();                          // free memory
			break;
		}

		if ((fsnav->mode < 0 || fsnav->core.host_termination == 1) && fsnav->core.exit_plugin_id == UINT_MAX) { // if termination was initiated by the current plugin on the current loop
			if (fsnav->mode > 0)
				fsnav->mode = -1;               // set mode to -1 for external termination cases

			if (fsnav->mode != 0)
				fsnav->core.exit_plugin_id = i; // set the index to use in the next loop
		}
	}

	if (fsnav->mode == 0) // if initialization ended
		fsnav->mode = 1;  // set operation mode to regular operation

	// success if either staying in regular operation mode, or a termination properly detected
	return (fsnav->mode >= 0) || (fsnav->core.exit_plugin_id < UINT_MAX);
}